

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O2

void FreeStyleProps(TidyDocImpl *doc,StyleProp *props)

{
  StyleProp *pSVar1;
  
  while (props != (StyleProp *)0x0) {
    pSVar1 = props->next;
    (*doc->allocator->vtbl->free)(doc->allocator,props->name);
    (*doc->allocator->vtbl->free)(doc->allocator,props->value);
    (*doc->allocator->vtbl->free)(doc->allocator,props);
    props = pSVar1;
  }
  return;
}

Assistant:

static void FreeStyleProps(TidyDocImpl* doc, StyleProp *props)
{
    StyleProp *next;

    while (props)
    {
        next = props->next;
        TidyDocFree(doc, props->name);
        TidyDocFree(doc, props->value);
        TidyDocFree(doc, props);
        props = next;
    }
}